

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

int VP8LColorSpaceTransform
              (int width,int height,int bits,int quality,uint32_t *argb,uint32_t *image,
              WebPPicture *pic,int percent_range,int *percent,int *best_bits)

{
  VP8LMultipliers prev_x_00;
  VP8LMultipliers VVar1;
  int iVar2;
  int bits_00;
  uint32_t uVar3;
  ulong uVar4;
  uint32_t in_EDX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  int *in_R8;
  long in_R9;
  undefined4 *in_stack_00000018;
  uint32_t pix;
  int ix_end;
  int ix;
  int offset;
  int all_y_max;
  int all_x_max;
  int tile_y_offset;
  int tile_x_offset;
  int y;
  VP8LMultipliers prev_y;
  VP8LMultipliers prev_x;
  int tile_y;
  int tile_x;
  uint32_t accumulated_blue_histo [256];
  uint32_t accumulated_red_histo [256];
  int percent_start;
  int tile_ysize;
  int tile_xsize;
  int max_tile_size;
  int *in_stack_fffffffffffff748;
  uint32_t max_tile_size_00;
  int in_stack_fffffffffffff754;
  WebPPicture *in_stack_fffffffffffff758;
  int *piVar5;
  undefined4 in_stack_fffffffffffff770;
  uint in_stack_fffffffffffff774;
  int in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  int in_stack_fffffffffffff780;
  undefined1 uVar6;
  int in_stack_fffffffffffff784;
  undefined1 uVar7;
  int in_stack_fffffffffffff788;
  undefined1 uVar8;
  undefined1 uVar9;
  int in_stack_fffffffffffff78c;
  int in_stack_fffffffffffff790;
  int in_stack_fffffffffffff794;
  int in_stack_fffffffffffff7a4;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffff7a8;
  uint8_t in_stack_fffffffffffff7a9;
  uint8_t in_stack_fffffffffffff7aa;
  uint8_t in_stack_fffffffffffff7ab;
  uint8_t in_stack_fffffffffffff7ac;
  uint8_t uStack_853;
  uint8_t local_852;
  int local_850;
  int local_84c;
  int local_848 [2];
  int in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7c8;
  uint32_t *in_stack_fffffffffffff7d0;
  uint32_t *in_stack_fffffffffffff7d8;
  uint32_t *in_stack_fffffffffffff7e0;
  WebPPicture local_448 [4];
  undefined4 local_40;
  uint32_t local_3c;
  uint32_t local_38;
  int local_34;
  long local_30;
  int *local_28;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t local_10;
  
  local_34 = 1 << ((byte)in_EDX & 0x1f);
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_EDI;
  local_38 = VP8LSubSampleSize(in_EDI,in_EDX);
  local_3c = VP8LSubSampleSize(local_14,local_18);
  local_40 = *in_stack_00000018;
  memset(local_448,0,0x400);
  memset(local_848,0,0x400);
  MultipliersClear((VP8LMultipliers *)&stack0xfffffffffffff7a9);
  MultipliersClear((VP8LMultipliers *)&stack0xfffffffffffff7ac);
  local_850 = 0;
  while( true ) {
    if ((int)local_3c <= local_850) {
      VP8LOptimizeSampling
                ((uint32_t *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                 in_stack_fffffffffffff78c,in_stack_fffffffffffff788,in_stack_fffffffffffff784,
                 in_stack_fffffffffffff780,
                 (int *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
      return 1;
    }
    for (local_84c = 0; uVar10 = (undefined1)((uint)in_stack_fffffffffffff7a4 >> 0x18),
        local_84c < (int)local_38; local_84c = local_84c + 1) {
      iVar2 = local_84c * local_34;
      in_stack_fffffffffffff7a4 = local_850 * local_34;
      bits_00 = GetMin(iVar2 + local_34,local_10);
      uVar6 = (undefined1)((uint)in_stack_fffffffffffff780 >> 0x18);
      uVar9 = (undefined1)in_stack_fffffffffffff78c;
      uVar7 = (undefined1)((uint)in_stack_fffffffffffff784 >> 0x18);
      uVar8 = (undefined1)((uint)in_stack_fffffffffffff788 >> 0x18);
      in_stack_fffffffffffff794 = GetMin(in_stack_fffffffffffff7a4 + local_34,local_14);
      in_stack_fffffffffffff790 = local_850 * local_38 + local_84c;
      if (local_850 != 0) {
        ColorCodeToMultipliers
                  (*(uint32_t *)(local_30 + (long)(int)(in_stack_fffffffffffff790 - local_38) * 4),
                   (VP8LMultipliers *)&stack0xfffffffffffff7a9);
      }
      in_stack_fffffffffffff788 =
           CONCAT22(CONCAT11(uVar8,local_852),CONCAT11(uStack_853,in_stack_fffffffffffff7ac));
      in_stack_fffffffffffff784 =
           CONCAT22(CONCAT11(uVar7,in_stack_fffffffffffff7ab),
                    CONCAT11(in_stack_fffffffffffff7aa,in_stack_fffffffffffff7a9));
      piVar5 = local_848;
      in_stack_fffffffffffff758 = local_448;
      prev_x_00.green_to_blue_ = in_stack_fffffffffffff7ab;
      prev_x_00.green_to_red_ = in_stack_fffffffffffff7aa;
      prev_x_00.red_to_blue_ = in_stack_fffffffffffff7ac;
      VVar1.green_to_blue_ = in_stack_fffffffffffff7a8;
      VVar1.green_to_red_ = uVar10;
      VVar1.red_to_blue_ = in_stack_fffffffffffff7a9;
      max_tile_size_00 = local_14;
      VVar1 = GetBestColorTransformForTile
                        (iVar2,in_stack_fffffffffffff7a4,bits_00,prev_x_00,VVar1,
                         in_stack_fffffffffffff794,in_stack_fffffffffffff7c0,
                         in_stack_fffffffffffff7c8,in_stack_fffffffffffff7d0,
                         in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
      local_852 = VVar1.red_to_blue_;
      in_stack_fffffffffffff78c = CONCAT13(local_852,CONCAT21(VVar1._0_2_,uVar9));
      in_stack_fffffffffffff7ac = VVar1.green_to_red_;
      uStack_853 = VVar1.green_to_blue_;
      uVar3 = MultipliersToColorCode((VP8LMultipliers *)&stack0xfffffffffffff7ac);
      *(uint32_t *)(local_30 + (long)in_stack_fffffffffffff790 * 4) = uVar3;
      in_stack_fffffffffffff780 =
           CONCAT22(CONCAT11(uVar6,local_852),CONCAT11(uStack_853,in_stack_fffffffffffff7ac));
      in_stack_fffffffffffff748 = local_28;
      CopyTileWithColorTransform
                ((int)piVar5,(int)((ulong)in_stack_fffffffffffff758 >> 0x20),
                 (int)in_stack_fffffffffffff758,in_stack_fffffffffffff754,max_tile_size_00,
                 SUB83((ulong)piVar5 >> 0x28,0),
                 (uint32_t *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
      for (; in_stack_fffffffffffff7a4 < in_stack_fffffffffffff794;
          in_stack_fffffffffffff7a4 = in_stack_fffffffffffff7a4 + 1) {
        in_stack_fffffffffffff77c = in_stack_fffffffffffff7a4 * local_10 + iVar2;
        in_stack_fffffffffffff778 = (in_stack_fffffffffffff77c + bits_00) - iVar2;
        for (; in_stack_fffffffffffff77c < in_stack_fffffffffffff778;
            in_stack_fffffffffffff77c = in_stack_fffffffffffff77c + 1) {
          in_stack_fffffffffffff774 = local_28[in_stack_fffffffffffff77c];
          if ((((in_stack_fffffffffffff77c < 2) ||
               (in_stack_fffffffffffff774 != local_28[in_stack_fffffffffffff77c + -2])) ||
              (in_stack_fffffffffffff774 != local_28[in_stack_fffffffffffff77c + -1])) &&
             (((in_stack_fffffffffffff77c < (int)(local_10 + 2) ||
               (local_28[in_stack_fffffffffffff77c + -2] !=
                local_28[(int)((in_stack_fffffffffffff77c - local_10) + -2)])) ||
              ((local_28[in_stack_fffffffffffff77c + -1] !=
                local_28[(int)((in_stack_fffffffffffff77c - local_10) + -1)] ||
               (in_stack_fffffffffffff774 != local_28[(int)(in_stack_fffffffffffff77c - local_10)]))
              )))) {
            uVar4 = (ulong)(in_stack_fffffffffffff774 >> 0x10 & 0xff);
            local_448[0].pad1[uVar4 - 0xf] = local_448[0].pad1[uVar4 - 0xf] + 1;
            local_848[in_stack_fffffffffffff774 & 0xff] =
                 local_848[in_stack_fffffffffffff774 & 0xff] + 1;
          }
        }
      }
    }
    iVar2 = WebPReportProgress(in_stack_fffffffffffff758,in_stack_fffffffffffff754,
                               in_stack_fffffffffffff748);
    if (iVar2 == 0) break;
    local_850 = local_850 + 1;
  }
  return 0;
}

Assistant:

int VP8LColorSpaceTransform(int width, int height, int bits, int quality,
                            uint32_t* const argb, uint32_t* image,
                            const WebPPicture* const pic, int percent_range,
                            int* const percent, int* const best_bits) {
  const int max_tile_size = 1 << bits;
  const int tile_xsize = VP8LSubSampleSize(width, bits);
  const int tile_ysize = VP8LSubSampleSize(height, bits);
  int percent_start = *percent;
  uint32_t accumulated_red_histo[256] = { 0 };
  uint32_t accumulated_blue_histo[256] = { 0 };
  int tile_x, tile_y;
  VP8LMultipliers prev_x, prev_y;
  MultipliersClear(&prev_y);
  MultipliersClear(&prev_x);
  for (tile_y = 0; tile_y < tile_ysize; ++tile_y) {
    for (tile_x = 0; tile_x < tile_xsize; ++tile_x) {
      int y;
      const int tile_x_offset = tile_x * max_tile_size;
      const int tile_y_offset = tile_y * max_tile_size;
      const int all_x_max = GetMin(tile_x_offset + max_tile_size, width);
      const int all_y_max = GetMin(tile_y_offset + max_tile_size, height);
      const int offset = tile_y * tile_xsize + tile_x;
      if (tile_y != 0) {
        ColorCodeToMultipliers(image[offset - tile_xsize], &prev_y);
      }
      prev_x = GetBestColorTransformForTile(tile_x, tile_y, bits,
                                            prev_x, prev_y,
                                            quality, width, height,
                                            accumulated_red_histo,
                                            accumulated_blue_histo,
                                            argb);
      image[offset] = MultipliersToColorCode(&prev_x);
      CopyTileWithColorTransform(width, height, tile_x_offset, tile_y_offset,
                                 max_tile_size, prev_x, argb);

      // Gather accumulated histogram data.
      for (y = tile_y_offset; y < all_y_max; ++y) {
        int ix = y * width + tile_x_offset;
        const int ix_end = ix + all_x_max - tile_x_offset;
        for (; ix < ix_end; ++ix) {
          const uint32_t pix = argb[ix];
          if (ix >= 2 &&
              pix == argb[ix - 2] &&
              pix == argb[ix - 1]) {
            continue;  // repeated pixels are handled by backward references
          }
          if (ix >= width + 2 &&
              argb[ix - 2] == argb[ix - width - 2] &&
              argb[ix - 1] == argb[ix - width - 1] &&
              pix == argb[ix - width]) {
            continue;  // repeated pixels are handled by backward references
          }
          ++accumulated_red_histo[(pix >> 16) & 0xff];
          ++accumulated_blue_histo[(pix >> 0) & 0xff];
        }
      }
    }
    if (!WebPReportProgress(
            pic, percent_start + percent_range * tile_y / tile_ysize,
            percent)) {
      return 0;
    }
  }
  VP8LOptimizeSampling(image, width, height, bits, MAX_TRANSFORM_BITS,
                       best_bits);
  return 1;
}